

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

_Bool pmu_counter_enabled(CPUARMState_conflict *env,uint8_t counter)

{
  byte bVar1;
  _Bool _Var2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool local_42;
  bool local_40;
  bool local_3f;
  uint16_t event;
  uint8_t hpmn;
  int el;
  _Bool secure;
  _Bool filtered;
  _Bool prohibited;
  _Bool enabled;
  _Bool m;
  _Bool nsh;
  _Bool nsu;
  _Bool nsk;
  _Bool u;
  _Bool p;
  _Bool e;
  uint64_t filter;
  uint8_t counter_local;
  CPUARMState_conflict *env_local;
  
  _Var2 = arm_is_secure(env);
  iVar4 = arm_current_el(env);
  bVar1 = (byte)(env->cp15).mdcr_el2;
  iVar5 = arm_feature(env,0x23);
  if (iVar5 == 0) {
    env_local._7_1_ = false;
  }
  else {
    iVar5 = arm_feature(env,0x20);
    if (((iVar5 == 0) || (counter < (bVar1 & 0x1f))) || (counter == '\x1f')) {
      uVar7 = (env->cp15).c9_pmcr & 1;
    }
    else {
      uVar7 = (env->cp15).mdcr_el2 & 0x80;
    }
    bVar8 = false;
    if (uVar7 != 0) {
      bVar8 = ((env->cp15).c9_pmcnten & 1L << (counter & 0x3f)) != 0;
    }
    if (_Var2) {
      iVar5 = arm_feature(env,0x21);
      bVar9 = false;
      if (iVar5 != 0) {
        bVar9 = ((env->cp15).mdcr_el3 & 0x20000) != 0;
      }
    }
    else if ((iVar4 == 2) && ((counter < (bVar1 & 7) || (counter == '\x1f')))) {
      bVar9 = ((env->cp15).mdcr_el2 & 0x20000) != 0;
    }
    else {
      bVar9 = false;
    }
    if ((bVar9) && (counter == '\x1f')) {
      bVar9 = ((env->cp15).c9_pmcr & 0x20) != 0;
    }
    if (counter == '\x1f') {
      _enabled = (env->cp15).pmccfiltr_el0;
    }
    else {
      _enabled = (env->cp15).c14_pmevtyper[counter];
    }
    bVar10 = (_enabled & 0x80000000) != 0;
    bVar11 = (_enabled & 0x40000000) != 0;
    iVar5 = arm_feature(env,0x21);
    local_3f = iVar5 != 0 && (_enabled & 0x20000000) != 0;
    iVar5 = arm_feature(env,0x21);
    local_40 = iVar5 != 0 && (_enabled & 0x10000000) != 0;
    iVar5 = arm_feature(env,0x20);
    _Var3 = arm_el_is_aa64(env,1);
    local_42 = false;
    if (_Var3) {
      iVar6 = arm_feature(env,0x21);
      local_42 = false;
      if (iVar6 != 0) {
        local_42 = (_enabled & 0x4000000) != 0;
      }
    }
    if (iVar4 == 0) {
      if (!_Var2) {
        bVar11 = bVar11 != local_40;
      }
    }
    else if (iVar4 == 1) {
      bVar11 = bVar10;
      if (!_Var2) {
        bVar11 = bVar10 != local_3f;
      }
    }
    else if (iVar4 == 2) {
      bVar11 = iVar5 == 0 || (_enabled & 0x8000000) == 0;
    }
    else {
      bVar11 = local_42 != bVar10;
    }
    if ((counter == '\x1f') || (_Var2 = event_supported((uint16_t)_enabled), _Var2)) {
      env_local._7_1_ = false;
      if ((bVar8) && (env_local._7_1_ = false, !bVar9)) {
        env_local._7_1_ = (_Bool)(bVar11 ^ 1);
      }
    }
    else {
      env_local._7_1_ = false;
    }
  }
  return env_local._7_1_;
}

Assistant:

static bool pmu_counter_enabled(CPUARMState *env, uint8_t counter)
{
    uint64_t filter;
    bool e, p, u, nsk, nsu, nsh, m;
    bool enabled, prohibited, filtered;
    bool secure = arm_is_secure(env);
    int el = arm_current_el(env);
    uint8_t hpmn = env->cp15.mdcr_el2 & MDCR_HPMN;

    if (!arm_feature(env, ARM_FEATURE_PMU)) {
        return false;
    }

    if (!arm_feature(env, ARM_FEATURE_EL2) ||
            (counter < hpmn || counter == 31)) {
        e = env->cp15.c9_pmcr & PMCRE;
    } else {
        e = env->cp15.mdcr_el2 & MDCR_HPME;
    }
    enabled = e && (env->cp15.c9_pmcnten & (1ULL << counter));

    if (!secure) {
        if (el == 2 && (counter < (hpmn & 0x7) || counter == 31)) {
            prohibited = env->cp15.mdcr_el2 & MDCR_HPMD;
        } else {
            prohibited = false;
        }
    } else {
        prohibited = arm_feature(env, ARM_FEATURE_EL3) &&
           (env->cp15.mdcr_el3 & MDCR_SPME);
    }

    if (prohibited && counter == 31) {
        prohibited = env->cp15.c9_pmcr & PMCRDP;
    }

    if (counter == 31) {
        filter = env->cp15.pmccfiltr_el0;
    } else {
        filter = env->cp15.c14_pmevtyper[counter];
    }

    p   = filter & PMXEVTYPER_P;
    u   = filter & PMXEVTYPER_U;
    nsk = arm_feature(env, ARM_FEATURE_EL3) && (filter & PMXEVTYPER_NSK);
    nsu = arm_feature(env, ARM_FEATURE_EL3) && (filter & PMXEVTYPER_NSU);
    nsh = arm_feature(env, ARM_FEATURE_EL2) && (filter & PMXEVTYPER_NSH);
    m   = arm_el_is_aa64(env, 1) &&
              arm_feature(env, ARM_FEATURE_EL3) && (filter & PMXEVTYPER_M);

    if (el == 0) {
        filtered = secure ? u : u != nsu;
    } else if (el == 1) {
        filtered = secure ? p : p != nsk;
    } else if (el == 2) {
        filtered = !nsh;
    } else { /* EL3 */
        filtered = m != p;
    }

    if (counter != 31) {
        /*
         * If not checking PMCCNTR, ensure the counter is setup to an event we
         * support
         */
        uint16_t event = filter & PMXEVTYPER_EVTCOUNT;
        if (!event_supported(event)) {
            return false;
        }
    }

    return enabled && !prohibited && !filtered;
}